

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  ulong uVar1;
  void *pvVar2;
  TValue TVar3;
  
  switch((ir->field_1).o) {
  case '\x16':
    uVar1 = ~((ulong)((ir->field_1).t.irt & 0x1f) << 0x2f);
    goto LAB_00116de1;
  case '\x17':
    TVar3.n = (lua_Number)ir->i;
    goto LAB_00116e2a;
  case '\x18':
    uVar1 = (long)(char)(~(ir->field_1).t.irt | 0xe0) << 0x2f | (ulong)ir[1];
LAB_00116de1:
    tv->u64 = uVar1;
    break;
  case '\x19':
  case '\x1a':
    tv->n = ((double)CONCAT44(0x45300000,SUB84(ir[1].gcr,4)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,ir[1].i) - 4503599627370496.0);
    break;
  case '\x1b':
    tv->u64 = 0;
    break;
  case '\x1c':
    TVar3 = *(TValue *)(ir + 1);
LAB_00116e2a:
    *tv = TVar3;
    break;
  case '\x1d':
    pvVar2 = lj_mem_newgco(L,0x18);
    *(undefined1 *)((long)pvVar2 + 9) = 10;
    *(undefined2 *)((long)pvVar2 + 10) = 0xb;
    *(IRIns *)((long)pvVar2 + 0x10) = ir[1];
    tv->u64 = (ulong)pvVar2 | 0xfffa800000000000;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lj_assertL(ir->o != IR_KSLOT, "unexpected KSLOT");  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setpriV(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR:
    setnumV(tv, (lua_Number)(uintptr_t)ir_kptr(ir));
    break;
  case IR_KNULL: setintV(tv, 0); break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lj_assertL(0, "bad IR constant op %d", ir->o); break;
  }
}